

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodMergeFromStream(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  scoped_array<const_google::protobuf::FieldDescriptor_*> sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Type type;
  WireType type_00;
  MessageOptions *this_00;
  FieldDescriptor **ppFVar5;
  ImmutableFieldLiteGenerator *pIVar6;
  int i_00;
  int i_01;
  string local_90;
  uint32 local_6c;
  undefined1 local_68 [4];
  uint32 packed_tag;
  uint32 local_44;
  FieldDescriptor *pFStack_40;
  uint32 tag;
  FieldDescriptor *field;
  int local_24;
  int i;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  sorted_fields.array_ = (FieldDescriptor **)printer;
  io::Printer::Print(printer,
                     "com.google.protobuf.CodedInputStream input =\n    (com.google.protobuf.CodedInputStream) arg0;\ncom.google.protobuf.ExtensionRegistryLite extensionRegistry =\n    (com.google.protobuf.ExtensionRegistryLite) arg1;\n"
                    );
  io::Printer::Print((Printer *)sorted_fields.array_,"try {\n");
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"boolean done = false;\nwhile (!done) {\n");
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"int tag = input.readTag();\nswitch (tag) {\n")
  ;
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"case 0:\n  done = true;\n  break;\n");
  bVar2 = PreserveUnknownFields((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    iVar4 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
    if (iVar4 < 1) {
      io::Printer::Print((Printer *)sorted_fields.array_,
                         "default: {\n  if (!parseUnknownField(tag, input)) {\n    done = true;\n  }\n  break;\n}\n"
                        );
    }
    else {
      this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
      bVar2 = MessageOptions::message_set_wire_format(this_00);
      if (bVar2) {
        io::Printer::Print((Printer *)sorted_fields.array_,
                           "default: {\n  if (!parseUnknownFieldAsMessageSet(\n      getDefaultInstanceForType(), input, extensionRegistry,\n      tag)) {\n    done = true;\n  }\n  break;\n}\n"
                          );
      }
      else {
        io::Printer::Print((Printer *)sorted_fields.array_,
                           "default: {\n  if (!parseUnknownField(getDefaultInstanceForType(),\n      input, extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
                          );
      }
    }
  }
  else {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "default: {\n  if (!input.skipField(tag)) {\n    done = true;\n  }\n  break;\n}\n"
                      );
  }
  ppFVar5 = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)&stack0xffffffffffffffe0,
             ppFVar5);
  for (local_24 = 0; iVar4 = local_24,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar4 < iVar3;
      local_24 = local_24 + 1) {
    ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                         &stack0xffffffffffffffe0,(long)local_24);
    pFStack_40 = *ppFVar5;
    iVar4 = FieldDescriptor::number(pFStack_40);
    type = FieldDescriptor::type(pFStack_40);
    type_00 = internal::WireFormat::WireTypeForFieldType(type);
    local_44 = internal::WireFormatLite::MakeTag(iVar4,type_00);
    sVar1 = sorted_fields;
    SimpleItoa_abi_cxx11_((string *)local_68,(protobuf *)(ulong)local_44,i_00);
    io::Printer::Print((Printer *)sVar1.array_,"case $tag$: {\n","tag",(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    io::Printer::Indent((Printer *)sorted_fields.array_);
    pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,pFStack_40);
    (*pIVar6->_vptr_ImmutableFieldLiteGenerator[10])(pIVar6,sorted_fields.array_);
    io::Printer::Outdent((Printer *)sorted_fields.array_);
    io::Printer::Print((Printer *)sorted_fields.array_,"  break;\n}\n");
    bVar2 = FieldDescriptor::is_packable(pFStack_40);
    if (bVar2) {
      iVar4 = FieldDescriptor::number(pFStack_40);
      local_6c = internal::WireFormatLite::MakeTag(iVar4,WIRETYPE_LENGTH_DELIMITED);
      sVar1 = sorted_fields;
      SimpleItoa_abi_cxx11_(&local_90,(protobuf *)(ulong)local_6c,i_01);
      io::Printer::Print((Printer *)sVar1.array_,"case $tag$: {\n","tag",&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      io::Printer::Indent((Printer *)sorted_fields.array_);
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,pFStack_40);
      (*pIVar6->_vptr_ImmutableFieldLiteGenerator[0xb])(pIVar6,sorted_fields.array_);
      io::Printer::Outdent((Printer *)sorted_fields.array_);
      io::Printer::Print((Printer *)sorted_fields.array_,"  break;\n}\n");
    }
  }
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"  }\n}\n");
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,
                     "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw new RuntimeException(e.setUnfinishedMessage(this));\n} catch (java.io.IOException e) {\n  throw new RuntimeException(\n      new com.google.protobuf.InvalidProtocolBufferException(\n          e.getMessage()).setUnfinishedMessage(this));\n} finally {\n"
                    );
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"}\n");
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodMergeFromStream(
    io::Printer* printer) {
  printer->Print(
      "com.google.protobuf.CodedInputStream input =\n"
      "    (com.google.protobuf.CodedInputStream) arg0;\n"
      "com.google.protobuf.ExtensionRegistryLite extensionRegistry =\n"
      "    (com.google.protobuf.ExtensionRegistryLite) arg1;\n");
  printer->Print(
      "try {\n");
  printer->Indent();
  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n");

  if (PreserveUnknownFields(descriptor_)) {
    if (descriptor_->extension_range_count() > 0) {
      if (descriptor_->options().message_set_wire_format()) {
        printer->Print(
            "default: {\n"
            "  if (!parseUnknownFieldAsMessageSet(\n"
            "      getDefaultInstanceForType(), input, extensionRegistry,\n"
            "      tag)) {\n"
            "    done = true;\n"  // it's an endgroup tag
            "  }\n"
            "  break;\n"
            "}\n");
      } else {
        printer->Print(
            "default: {\n"
            "  if (!parseUnknownField(getDefaultInstanceForType(),\n"
            "      input, extensionRegistry, tag)) {\n"
            "    done = true;\n"  // it's an endgroup tag
            "  }\n"
            "  break;\n"
            "}\n");
      }
    } else {
      printer->Print(
        "default: {\n"
        "  if (!parseUnknownField(tag, input)) {\n"
        "    done = true;\n"  // it's an endgroup tag
        "  }\n"
        "  break;\n"
        "}\n");
    }
  } else {
    printer->Print(
      "default: {\n"
      "  if (!input.skipField(tag)) {\n"
      "    done = true;\n"  // it's an endgroup tag
      "  }\n"
      "  break;\n"
      "}\n");
  }

  google::protobuf::scoped_array<const FieldDescriptor * > sorted_fields(
      SortFieldsByNumber(descriptor_));
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(static_cast<int32>(tag)));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(static_cast<int32>(packed_tag)));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw new RuntimeException(e.setUnfinishedMessage(this));\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new RuntimeException(\n"
      "      new com.google.protobuf.InvalidProtocolBufferException(\n"
      "          e.getMessage()).setUnfinishedMessage(this));\n"
      "} finally {\n");
  printer->Indent();

  printer->Outdent();
  printer->Print(
      "}\n");     // finally
}